

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O3

void progressbarinit(ProgressData *bar,OperationConfig *config)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char *in_RAX;
  char *__nptr;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  char *endptr;
  undefined8 local_38;
  
  bar->initial_size = 0;
  bar->tick = 0;
  bar->bar = 0;
  *(undefined8 *)&bar->width = 0;
  bar->out = (FILE *)0x0;
  (bar->prevtime).tv_sec = 0;
  (bar->prevtime).tv_usec = 0;
  *(undefined8 *)bar = 0;
  bar->prev = 0;
  *(undefined8 *)&bar->barmove = 0;
  if (config->use_resume == true) {
    bar->initial_size = config->resume_from;
  }
  local_38 = in_RAX;
  __nptr = (char *)curl_getenv();
  if (__nptr != (char *)0x0) {
    lVar4 = strtol(__nptr,(char **)&local_38,10);
    pcVar1 = local_38;
    if ((local_38 != __nptr) && (sVar5 = strlen(__nptr), 0x14 < lVar4 && pcVar1 == __nptr + sVar5))
    {
      bar->width = (int)lVar4;
    }
    curl_free();
  }
  uVar3 = bar->width;
  if (uVar3 == 0) {
    iVar2 = ioctl(0,0x5413,&local_38);
    uVar3 = (uint)local_38._2_2_;
    uVar6 = 0;
    if (iVar2 == 0) {
      uVar6 = uVar3;
    }
    bar->width = uVar6;
    if (uVar6 != 0) goto LAB_0010c567;
    iVar2 = 0x4f;
  }
  else {
LAB_0010c567:
    iVar2 = 0x100;
    if ((int)uVar3 < 0x101) goto LAB_0010c57d;
  }
  bar->width = iVar2;
LAB_0010c57d:
  bar->out = config->global->errors;
  bar->tick = 0x96;
  bar->barmove = 1;
  return;
}

Assistant:

void progressbarinit(struct ProgressData *bar,
                     struct OperationConfig *config)
{
  char *colp;
  memset(bar, 0, sizeof(struct ProgressData));

  /* pass this through to progress function so
   * it can display progress towards total file
   * not just the part that's left. (21-may-03, dbyron) */
  if(config->use_resume)
    bar->initial_size = config->resume_from;

  colp = curlx_getenv("COLUMNS");
  if(colp) {
    char *endptr;
    long num = strtol(colp, &endptr, 10);
    if((endptr != colp) && (endptr == colp + strlen(colp)) && (num > 20))
      bar->width = (int)num;
    curl_free(colp);
  }

  if(!bar->width) {
    int cols = 0;

#ifdef TIOCGSIZE
    struct ttysize ts;
    if(!ioctl(STDIN_FILENO, TIOCGSIZE, &ts))
      cols = ts.ts_cols;
#elif defined(TIOCGWINSZ)
    struct winsize ts;
    if(!ioctl(STDIN_FILENO, TIOCGWINSZ, &ts))
      cols = ts.ws_col;
#elif defined(_WIN32)
    {
      HANDLE  stderr_hnd = GetStdHandle(STD_ERROR_HANDLE);
      CONSOLE_SCREEN_BUFFER_INFO console_info;

      if((stderr_hnd != INVALID_HANDLE_VALUE) &&
         GetConsoleScreenBufferInfo(stderr_hnd, &console_info)) {
        /*
         * Do not use +1 to get the true screen-width since writing a
         * character at the right edge will cause a line wrap.
         */
        cols = (int)
          (console_info.srWindow.Right - console_info.srWindow.Left);
      }
    }
#endif /* TIOCGSIZE */
    bar->width = cols;
  }

  if(!bar->width)
    bar->width = 79;
  else if(bar->width > MAX_BARLENGTH)
    bar->width = MAX_BARLENGTH;

  bar->out = config->global->errors;
  bar->tick = 150;
  bar->barmove = 1;
}